

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O3

void __thiscall
capnp::compiler::TypeIdGenerator::update
          (TypeIdGenerator *this,ArrayPtr<const_unsigned_char> dataArray)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  byte *ptr;
  uint uVar3;
  byte *__dest;
  ulong __n_00;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  __n = dataArray.size_;
  ptr = dataArray.ptr;
  _kjCondition.value = (bool)(this->finished ^ 1);
  if (this->finished != false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/type-id.c++"
               ,0x158,FAILED,"!finished","_kjCondition,\"already called TypeIdGenerator::finish()\""
               ,&_kjCondition,(char (*) [41])"already called TypeIdGenerator::finish()");
    kj::_::Debug::Fault::fatal(&f);
  }
  uVar1 = (this->ctx).lo;
  uVar2 = (this->ctx).hi;
  uVar3 = (int)dataArray.size_ + uVar1 & 0x1fffffff;
  (this->ctx).lo = uVar3;
  if (uVar3 < uVar1) {
    uVar2 = uVar2 + 1;
    (this->ctx).hi = uVar2;
  }
  (this->ctx).hi = (int)(__n >> 0x1d) + uVar2;
  if ((uVar1 & 0x3f) != 0) {
    __n_00 = 0x40 - ((ulong)uVar1 & 0x3f);
    __dest = (this->ctx).buffer + ((ulong)uVar1 & 0x3f);
    if (__n < __n_00) goto LAB_00399c1a;
    memcpy(__dest,ptr,__n_00);
    ptr = ptr + __n_00;
    body(this,(this->ctx).buffer,0x40);
    __n = __n - __n_00;
  }
  if (0x3f < __n) {
    ptr = body(this,ptr,__n & 0xffffffffffffffc0);
    __n = (ulong)((uint)__n & 0x3f);
  }
  __dest = (this->ctx).buffer;
LAB_00399c1a:
  memcpy(__dest,ptr,__n);
  return;
}

Assistant:

void TypeIdGenerator::update(kj::ArrayPtr<const kj::byte> dataArray)
{
  KJ_REQUIRE(!finished, "already called TypeIdGenerator::finish()");

  const kj::byte* data = dataArray.begin();
  unsigned long size = dataArray.size();

  uint saved_lo;
  unsigned long used, free;

  saved_lo = ctx.lo;
  if ((ctx.lo = (saved_lo + size) & 0x1fffffff) < saved_lo)
    ctx.hi++;
  ctx.hi += size >> 29;

  used = saved_lo & 0x3f;

  if (used) {
    free = 64 - used;

    if (size < free) {
      memcpy(&ctx.buffer[used], data, size);
      return;
    }

    memcpy(&ctx.buffer[used], data, free);
    data = data + free;
    size -= free;
    body(ctx.buffer, 64);
  }

  if (size >= 64) {
    data = body(data, size & ~(unsigned long)0x3f);
    size &= 0x3f;
  }

  memcpy(ctx.buffer, data, size);
}